

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Colour::SetMasteringMetadata(Colour *this,MasteringMetadata *mastering_metadata)

{
  bool bVar1;
  MasteringMetadata *pMVar2;
  pointer pMVar3;
  PrimaryChromaticity *r;
  PrimaryChromaticity *g;
  PrimaryChromaticity *b;
  PrimaryChromaticity *white_point;
  int in_ECX;
  void *extraout_RDX;
  char *in_R8;
  int in_R9D;
  float fVar4;
  int in_stack_ffffffffffffff58;
  unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
  local_28;
  unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_> mm_ptr;
  MasteringMetadata *mastering_metadata_local;
  Colour *this_local;
  
  mm_ptr._M_t.
  super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
  ._M_t.
  super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
  .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl =
       (__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
        )(__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
          )mastering_metadata;
  pMVar2 = (MasteringMetadata *)operator_new(0x28);
  MasteringMetadata::MasteringMetadata(pMVar2);
  std::unique_ptr<mkvmuxer::MasteringMetadata,std::default_delete<mkvmuxer::MasteringMetadata>>::
  unique_ptr<std::default_delete<mkvmuxer::MasteringMetadata>,void>
            ((unique_ptr<mkvmuxer::MasteringMetadata,std::default_delete<mkvmuxer::MasteringMetadata>>
              *)&local_28,pMVar2);
  pMVar3 = std::
           unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
           ::get(&local_28);
  if (pMVar3 == (pointer)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pMVar3 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->(&local_28);
    fVar4 = MasteringMetadata::luminance_max
                      ((MasteringMetadata *)
                       mm_ptr._M_t.
                       super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    MasteringMetadata::set_luminance_max(pMVar3,fVar4);
    pMVar3 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->(&local_28);
    fVar4 = MasteringMetadata::luminance_min
                      ((MasteringMetadata *)
                       mm_ptr._M_t.
                       super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    MasteringMetadata::set_luminance_min(pMVar3,fVar4);
    pMVar3 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->(&local_28);
    MasteringMetadata::r
              ((MasteringMetadata *)
               mm_ptr._M_t.
               super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
               .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl,pMVar2,
               extraout_RDX,in_ECX,in_R8,in_R9D,in_stack_ffffffffffffff58);
    g = MasteringMetadata::g
                  ((MasteringMetadata *)
                   mm_ptr._M_t.
                   super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    b = MasteringMetadata::b
                  ((MasteringMetadata *)
                   mm_ptr._M_t.
                   super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                   .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl);
    white_point = MasteringMetadata::white_point
                            ((MasteringMetadata *)
                             mm_ptr._M_t.
                             super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                             .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>.
                             _M_head_impl);
    bVar1 = MasteringMetadata::SetChromaticity(pMVar3,r,g,b,white_point);
    if (bVar1) {
      pMVar2 = this->mastering_metadata_;
      if (pMVar2 != (MasteringMetadata *)0x0) {
        MasteringMetadata::~MasteringMetadata(pMVar2);
        operator_delete(pMVar2);
      }
      pMVar3 = std::
               unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
               ::release(&local_28);
      this->mastering_metadata_ = pMVar3;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  std::unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>::
  ~unique_ptr(&local_28);
  return this_local._7_1_;
}

Assistant:

bool Colour::SetMasteringMetadata(const MasteringMetadata& mastering_metadata) {
  std::unique_ptr<MasteringMetadata> mm_ptr(new MasteringMetadata());
  if (!mm_ptr.get())
    return false;

  mm_ptr->set_luminance_max(mastering_metadata.luminance_max());
  mm_ptr->set_luminance_min(mastering_metadata.luminance_min());

  if (!mm_ptr->SetChromaticity(mastering_metadata.r(), mastering_metadata.g(),
                               mastering_metadata.b(),
                               mastering_metadata.white_point())) {
    return false;
  }

  delete mastering_metadata_;
  mastering_metadata_ = mm_ptr.release();
  return true;
}